

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O3

vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
* __thiscall
phmap::priv::
keys<phmap::parallel_node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,4ul,phmap::NullMutex>>
          (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
           *__return_storage_ptr__,priv *this,
          parallel_node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>
          *s)

{
  iterator __position;
  long lVar1;
  size_type __n;
  const_iterator __begin0;
  iterator local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0x10;
  __n = 0;
  do {
    __n = __n + *(long *)(this + lVar1);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x490);
  std::
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  ::reserve(__return_storage_ptr__,__n);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::begin((const_iterator *)&local_40,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
           *)this);
  while (local_40.inner_ != (Inner *)0x0) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
      ::_M_realloc_insert<phmap::priv::hash_internal::EnumClass_const&>
                ((vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
                  *)__return_storage_ptr__,__position,*local_40.it_.field_1.slot_);
    }
    else {
      *__position._M_current = **local_40.it_.field_1.slot_;
      (__return_storage_ptr__->
      super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
    ::iterator::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto keys(const Set& s)
    -> std::vector<typename std::decay<typename Set::key_type>::type> {
  std::vector<typename std::decay<typename Set::key_type>::type> res;
  res.reserve(s.size());
  for (const auto& v : s) res.emplace_back(v);
  return res;
}